

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.cpp
# Opt level: O1

void __thiscall
TPZParFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontNonSym<std::complex<long_double>_>_>
::TPZParFrontMatrix(TPZParFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontNonSym<std::complex<long_double>_>_>
                    *this)

{
  TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontNonSym<std::complex<long_double>_>_>
  ::TPZFrontMatrix(&this->
                    super_TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontNonSym<std::complex<long_double>_>_>
                   ,&PTR_PTR_019bb8a0);
  (this->
  super_TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontNonSym<std::complex<long_double>_>_>
  ).super_TPZAbstractFrontMatrix<std::complex<long_double>_>.
  super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
       = (_func_int **)&PTR__TPZParFrontMatrix_019bb618;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<std::complex<long_double>_>_*,_10>.
  super_TPZVec<TPZEqnArray<std::complex<long_double>_>_*>.fStore =
       (TPZEqnArray<std::complex<long_double>_> **)0x0;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<std::complex<long_double>_>_*,_10>.
  super_TPZVec<TPZEqnArray<std::complex<long_double>_>_*>.fNElements = 0;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<std::complex<long_double>_>_*,_10>.
  super_TPZVec<TPZEqnArray<std::complex<long_double>_>_*>.fNAlloc = 0;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<std::complex<long_double>_>_*,_10>.
  super_TPZVec<TPZEqnArray<std::complex<long_double>_>_*>.fStore =
       (this->fEqnStack).super_TPZManVector<TPZEqnArray<std::complex<long_double>_>_*,_10>.fExtAlloc
  ;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<std::complex<long_double>_>_*,_10>.
  super_TPZVec<TPZEqnArray<std::complex<long_double>_>_*>.fNElements = 0;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<std::complex<long_double>_>_*,_10>.
  super_TPZVec<TPZEqnArray<std::complex<long_double>_>_*>.fNAlloc = 0;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<std::complex<long_double>_>_*,_10>.
  super_TPZVec<TPZEqnArray<std::complex<long_double>_>_*>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_019c9bc0;
  this->fFinish = 0;
  (this->fwritelock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->fwritelock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->fwritelock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->fwritelock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->fwritelock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->fwritecond);
  TPZManVector<TPZEqnArray<std::complex<long_double>_>_*,_10>::Resize
            (&(this->fEqnStack).super_TPZManVector<TPZEqnArray<std::complex<long_double>_>_*,_10>,0)
  ;
  return;
}

Assistant:

TPZParFrontMatrix<TVar, store, front>::TPZParFrontMatrix():
TPZRegisterClassId(&TPZParFrontMatrix::ClassId), fFinish(0), fwritelock(), fwritecond()
{
	fEqnStack.Resize(0);
}